

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_ChaseLastKnownPosition(void)

{
  Task *in_RDI;
  int in_R8D;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  float in_XMM2_Da;
  Vector3 debugSphereColour;
  _Any_data local_748;
  _Manager_type local_738;
  _Invoker_type p_Stack_730;
  string local_720;
  Task local_700;
  Task bark;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"chaseLastKnownPosition",(allocator<char> *)&bark);
  Task::Task(in_RDI,&local_720,Compound);
  std::__cxx11::string::~string((string *)&local_720);
  in_RDI->identifier = ChaseLastKnownPosition;
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::emplace_back<ConsumableFact>
            (&(in_RDI->preconditions).consumableVectors,(ConsumableFact *)&bark);
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._4_1_ = 0;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)&bark);
  create_Bark(&bark,LostSightOfPlayer);
  debugSphereColour.y = (float)in_XMM1_Db;
  debugSphereColour.x = (float)in_XMM1_Da;
  debugSphereColour.z = in_XMM2_Da;
  create_MoveToDestination(&local_700,(AI *)0x1,320.0,debugSphereColour,1.0,true,true,in_R8D);
  local_748._M_unused._M_member_pointer = (ulong)(uint)local_748._4_4_ << 0x20;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::emplace_back<ConsumableFact>
            (&local_700.preconditions.consumableVectors,(ConsumableFact *)local_748._M_pod_data);
  local_738 = local_700.setup.super__Function_base._M_manager;
  local_748._M_unused._M_object =
       local_700.setup.super__Function_base._M_functor._M_unused._M_object;
  local_748._8_8_ = local_700.setup.super__Function_base._M_functor._8_8_;
  local_700.setup.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_700.setup.super__Function_base._M_functor._8_8_ = 0;
  local_700.setup.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:315:35)>
       ::_M_manager;
  p_Stack_730 = local_700.setup._M_invoker;
  local_700.setup._M_invoker =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:315:35)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_748);
  local_738 = local_700.loop.super__Function_base._M_manager;
  local_748._M_unused._M_object = local_700.loop.super__Function_base._M_functor._M_unused._M_object
  ;
  local_748._8_8_ = local_700.loop.super__Function_base._M_functor._8_8_;
  local_700.loop.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_700.loop.super__Function_base._M_functor._8_8_ = 0;
  local_700.loop.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:319:34)>
       ::_M_manager;
  p_Stack_730 = (_Invoker_type)local_700.loop._M_invoker;
  local_700.loop._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:319:34)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_748);
  local_738 = local_700.finish.super__Function_base._M_manager;
  local_748._M_unused._M_object =
       local_700.finish.super__Function_base._M_functor._M_unused._M_object;
  local_748._8_8_ = local_700.finish.super__Function_base._M_functor._8_8_;
  local_700.finish.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_700.finish.super__Function_base._M_functor._8_8_ = 0;
  local_700.finish.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:332:36)>
       ::_M_manager;
  p_Stack_730 = (_Invoker_type)local_700.finish._M_invoker;
  local_700.finish._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:332:36)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_748);
  local_738 = local_700.finally.super__Function_base._M_manager;
  local_748._M_unused._M_object =
       local_700.finally.super__Function_base._M_functor._M_unused._M_object;
  local_748._8_8_ = local_700.finally.super__Function_base._M_functor._8_8_;
  local_700.finally.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_700.finally.super__Function_base._M_functor._8_8_ = 0;
  local_700.finally.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:337:37)>
       ::_M_manager;
  p_Stack_730 = (_Invoker_type)local_700.finally._M_invoker;
  local_700.finally._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:337:37)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_748);
  Task::addSubtask(in_RDI,&bark);
  Task::addSubtask(in_RDI,&local_700);
  Task::~Task(&local_700);
  Task::~Task(&bark);
  return in_RDI;
}

Assistant:

Task create_ChaseLastKnownPosition()
	{
		Task chaseLastKnownPosition {"chaseLastKnownPosition", TaskType::Compound};
		chaseLastKnownPosition.identifier = TaskIdentifier::ChaseLastKnownPosition;
		chaseLastKnownPosition.preconditions.consumableVectors.push_back(ConsumableFact::Player_LastKnownLocation);
		chaseLastKnownPosition.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, false});

		auto bark = create_Bark(Bark::LostSightOfPlayer);	

		auto moveToLastKnownLocation = create_MoveToDestination(320.f, {0.f, 1.f, 0.f});
		moveToLastKnownLocation.preconditions.consumableVectors.push_back(ConsumableFact::Player_LastKnownLocation);
		moveToLastKnownLocation.setup = [=](Task& task, WorldState& state, const WorldQuerier&)
		{
			state.current.vectors[WorldStateIdentifier::Destination] = state.facts.vectors[ConsumableFact::Player_LastKnownLocation].value;
		};
		moveToLastKnownLocation.loop = [](WorldState& state, WorldQuerier const&, Task& task)
		{
			/*auto& target = state.current.vectors[WorldStateIdentifier::PlayerPosition];
			auto& start = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto xAxis = target - start;
			xAxis.normalize();
			
			state.animationDriver->isHeadTracking = true;
			state.animationDriver->headRotation = 				
				(FRotationMatrix::MakeFromXZ(xAxis, {0.f, 0.f, 1.f}).ToQuat() * FQuat(FRotator(90, 0, 0)) * FQuat(FRotator(0.f, 0.f, 90.f))).Rotator();
			*/
		};

		moveToLastKnownLocation.finish = [](WorldState& state, Task& task)
		{
			state.consumeFactVector(ConsumableFact::Player_LastKnownLocation);
		};

		moveToLastKnownLocation.finally = [](WorldState& state)
		{
			//state.animationDriver->isHeadTracking = false;
		};
		
		chaseLastKnownPosition.addSubtask(bark);
		chaseLastKnownPosition.addSubtask(moveToLastKnownLocation);

		return chaseLastKnownPosition;
	}